

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_hash_table.hpp
# Opt level: O0

void __thiscall
poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>::show_stats
          (standard_hash_table<80U,_poplar::hash::vigna_hasher> *this,ostream *os,int n)

{
  uint64_t uVar1;
  string *indent_00;
  ostream *in_RSI;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_RDI;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [16];
  undefined1 in_ZMM1 [64];
  string indent;
  char (*in_stack_ffffffffffffff38) [20];
  char *in_stack_ffffffffffffff40;
  ostream *k;
  string *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  ostream *os_00;
  undefined8 in_stack_ffffffffffffff68;
  string local_38 [40];
  ostream *local_10;
  
  auVar3 = in_ZMM1._0_16_;
  auVar2 = in_ZMM0._0_16_;
  local_10 = in_RSI;
  get_indent_abi_cxx11_((int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  show_stat<char[20]>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                      in_stack_ffffffffffffff38);
  uVar1 = size(in_RDI);
  vcvtusi2sd_avx512f(auVar2,uVar1);
  uVar1 = capa_size((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)0x1424af);
  vcvtusi2sd_avx512f(auVar3,uVar1);
  show_stat<double>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                    (double *)in_stack_ffffffffffffff38);
  show_stat<unsigned_int>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (uint *)in_stack_ffffffffffffff38);
  os_00 = local_10;
  size(in_RDI);
  show_stat<unsigned_long>
            (os_00,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (unsigned_long *)in_stack_ffffffffffffff38);
  k = local_10;
  indent_00 = (string *)capa_size((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)0x142587);
  show_stat<unsigned_long>(os_00,indent_00,(char *)k,(unsigned_long *)in_stack_ffffffffffffff38);
  alloc_bytes((standard_hash_table<80U,_poplar::hash::vigna_hasher> *)0x1425ce);
  show_stat<unsigned_long>(os_00,indent_00,(char *)k,(unsigned_long *)local_10);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "standard_hash_table");
        show_stat(os, indent, "factor", double(size()) / capa_size() * 100);
        show_stat(os, indent, "max_factor", MaxFactor);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "capa_size", capa_size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "num_resize", num_resize_);
#endif
    }